

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_reduceIndex(ZSTD_CCtx *zc,U32 reducerValue)

{
  U32 size;
  U32 in_ESI;
  long in_RDI;
  U32 h3Size;
  U32 chainSize;
  U32 hSize;
  ZSTD_matchState_t *ms;
  
  ZSTD_reduceTable(*(U32 **)(in_RDI + 0x298),1 << ((byte)*(undefined4 *)(in_RDI + 0x94) & 0x1f),
                   in_ESI);
  if (*(int *)(in_RDI + 0xa4) != 1) {
    size = 1 << ((byte)*(undefined4 *)(in_RDI + 0x90) & 0x1f);
    if (*(int *)(in_RDI + 0xa4) == 6) {
      ZSTD_reduceTable_btlazy2(*(U32 **)(in_RDI + 0x2a8),size,in_ESI);
    }
    else {
      ZSTD_reduceTable(*(U32 **)(in_RDI + 0x2a8),size,in_ESI);
    }
  }
  if (*(int *)(in_RDI + 0x294) != 0) {
    ZSTD_reduceTable(*(U32 **)(in_RDI + 0x2a0),1 << ((byte)*(undefined4 *)(in_RDI + 0x294) & 0x1f),
                     in_ESI);
  }
  return;
}

Assistant:

static void ZSTD_reduceIndex (ZSTD_CCtx* zc, const U32 reducerValue)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    {   U32 const hSize = (U32)1 << zc->appliedParams.cParams.hashLog;
        ZSTD_reduceTable(ms->hashTable, hSize, reducerValue);
    }

    if (zc->appliedParams.cParams.strategy != ZSTD_fast) {
        U32 const chainSize = (U32)1 << zc->appliedParams.cParams.chainLog;
        if (zc->appliedParams.cParams.strategy == ZSTD_btlazy2)
            ZSTD_reduceTable_btlazy2(ms->chainTable, chainSize, reducerValue);
        else
            ZSTD_reduceTable(ms->chainTable, chainSize, reducerValue);
    }

    if (ms->hashLog3) {
        U32 const h3Size = (U32)1 << ms->hashLog3;
        ZSTD_reduceTable(ms->hashTable3, h3Size, reducerValue);
    }
}